

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoder.cpp
# Opt level: O1

Result * __thiscall
CoreML::OneHotEncoder::setHandleUnknown
          (Result *__return_storage_ptr__,OneHotEncoder *this,MLHandleUnknown state)

{
  Model *this_00;
  ulong uVar1;
  OneHotEncoder *pOVar2;
  Arena *arena;
  
  this_00 = (this->super_Model).m_spec.
            super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00->_oneof_case_[0] != 600) {
    Specification::Model::clear_Type(this_00);
    this_00->_oneof_case_[0] = 600;
    uVar1 = (this_00->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    pOVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::OneHotEncoder>
                       (arena);
    (this_00->Type_).onehotencoder_ = pOVar2;
  }
  (((this_00->Type_).supportvectorclassifier_)->numberofsupportvectorsperclass_).total_size_ = state
  ;
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Result OneHotEncoder::setHandleUnknown(MLHandleUnknown state) {
        auto ohe = m_spec->mutable_onehotencoder();
        ohe->set_handleunknown(static_cast<Specification::OneHotEncoder_HandleUnknown>(state));

        return Result();
    }